

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void AddWindowToRenderList(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  ImGuiWindow *window_00;
  int iVar1;
  long lVar2;
  
  AddDrawListToRenderList(out_render_list,window->DrawList);
  iVar1 = (window->DC).ChildWindows.Size;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      window_00 = (window->DC).ChildWindows.Data[lVar2];
      if ((window_00->Active == true) &&
         (((window_00->Flags & 0x2000000) == 0 || (window_00->HiddenFrames < 1)))) {
        AddWindowToRenderList(out_render_list,window_00);
        iVar1 = (window->DC).ChildWindows.Size;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  return;
}

Assistant:

static void AddWindowToRenderList(ImVector<ImDrawList*>& out_render_list, ImGuiWindow* window)
{
    AddDrawListToRenderList(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (!child->Active) // clipped children may have been marked not active
            continue;
        if ((child->Flags & ImGuiWindowFlags_Popup) && child->HiddenFrames > 0)
            continue;
        AddWindowToRenderList(out_render_list, child);
    }
}